

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm.c
# Opt level: O3

float ** directions(PGMData *gy,PGMData *gx)

{
  int iVar1;
  uint uVar2;
  float *pfVar3;
  float **ppfVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  
  ppfVar4 = mem_alloc(gy->row,gy->col);
  iVar1 = gy->row;
  uVar6 = (ulong)iVar1;
  if (0 < (long)uVar6) {
    uVar2 = gy->col;
    uVar8 = 0;
    do {
      if (0 < (int)uVar2) {
        memset(ppfVar4[uVar8],0,(ulong)uVar2 << 2);
      }
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
    if (0 < iVar1) {
      uVar8 = (ulong)(uint)gy->col;
      lVar5 = 0;
      do {
        if (0 < (int)uVar8) {
          pfVar3 = ppfVar4[lVar5];
          lVar7 = 0;
          do {
            fVar9 = atanf(gy->pixel_matrix[lVar5][lVar7] / gx->pixel_matrix[lVar5][lVar7]);
            pfVar3[lVar7] = fVar9;
            lVar7 = lVar7 + 1;
            uVar8 = (ulong)gy->col;
          } while (lVar7 < (long)uVar8);
          uVar6 = (ulong)(uint)gy->row;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)uVar6);
    }
  }
  return ppfVar4;
}

Assistant:

float **directions(PGMData *gy, PGMData *gx)
{
    float **dir_matrix = mem_alloc(gy->row, gy->col);
    for (int i = 0; i < gy->row; ++i)
    {
        for (int j = 0; j < gy->col; ++j)
        {
            dir_matrix[i][j] = 0;
        }
    }

    for (int i = 0; i < gy->row; ++i)
    {
        for (int j = 0; j < gy->col; ++j)
        {
            dir_matrix[i][j] = atanf(gy->pixel_matrix[i][j] / gx->pixel_matrix[i][j]);
        }
    }

    return dir_matrix;
}